

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O1

bool __thiscall
nlohmann::detail::
parser<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>
::
sax_parse_internal<nlohmann::detail::json_sax_dom_callback_parser<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>>
          (parser<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>
           *this,json_sax_dom_callback_parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                 *sax)

{
  lexer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
  *this_00;
  ulong uVar1;
  size_t sVar2;
  bool bVar3;
  bool bVar4;
  token_type tVar5;
  long *plVar6;
  ulong uVar7;
  size_type *psVar8;
  bool bVar9;
  vector<bool,_std::allocator<bool>_> states;
  string local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  undefined1 local_d0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c0;
  undefined1 local_b0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a0;
  string local_88;
  vector<bool,_std::allocator<bool>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_40;
  ulong local_38;
  
  bVar3 = false;
  local_68.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
  super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  local_68.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
  super__Bit_iterator_base._M_offset = 0;
  local_68.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
  super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  local_68.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
  super__Bit_iterator_base._M_offset = 0;
  local_68.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_end_of_storage = (_Bit_pointer)0x0;
  this_00 = (lexer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
             *)(this + 0x28);
  local_40 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(this + 0x70);
  bVar4 = false;
LAB_001158a7:
  if (bVar3) {
    bVar3 = false;
    goto LAB_00115949;
  }
  switch(*(undefined4 *)(this + 0x20)) {
  case 1:
    local_b0[0] = 1;
    json_sax_dom_callback_parser<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>
    ::handle_value<bool&>
              ((json_sax_dom_callback_parser<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>
                *)sax,(bool *)local_b0,false);
    break;
  case 2:
    local_b0._0_8_ = (ulong)(uint7)local_b0._1_7_ << 8;
    json_sax_dom_callback_parser<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>
    ::handle_value<bool&>
              ((json_sax_dom_callback_parser<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>
                *)sax,(bool *)local_b0,false);
    break;
  case 3:
    local_b0._0_8_ = (undefined **)0x0;
    json_sax_dom_callback_parser<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>
    ::handle_value<decltype(nullptr)>
              ((json_sax_dom_callback_parser<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>
                *)sax,(void **)local_b0,false);
    break;
  case 4:
    json_sax_dom_callback_parser<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>
    ::handle_value<std::__cxx11::string&>
              ((json_sax_dom_callback_parser<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>
                *)sax,local_40,false);
    break;
  case 5:
    local_b0._0_8_ = *(undefined8 *)(this + 0xa0);
    json_sax_dom_callback_parser<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>
    ::handle_value<unsigned_long&>
              ((json_sax_dom_callback_parser<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>
                *)sax,(unsigned_long *)local_b0,false);
    break;
  case 6:
    local_b0._0_8_ = *(undefined8 *)(this + 0x98);
    json_sax_dom_callback_parser<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>
    ::handle_value<long&>
              ((json_sax_dom_callback_parser<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>
                *)sax,(long *)local_b0,false);
    break;
  case 7:
    local_38 = (ulong)*(undefined ***)(this + 0xa8) & 0x7fffffffffffffff;
    if (local_38 < 0x7ff0000000000000) {
      local_b0._0_8_ = *(undefined ***)(this + 0xa8);
      json_sax_dom_callback_parser<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>
      ::handle_value<double&>
                ((json_sax_dom_callback_parser<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>
                  *)sax,(double *)local_b0,false);
    }
    else {
      sVar2 = *(size_t *)(this + 0x40);
      lexer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
      ::get_token_string((string *)local_b0,this_00);
      lexer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
      ::get_token_string(&local_88,this_00);
      std::operator+(&local_f0,"number overflow parsing \'",&local_88);
      plVar6 = (long *)std::__cxx11::string::append((char *)&local_f0);
      local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
      psVar8 = (size_type *)(plVar6 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar6 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar8) {
        local_110.field_2._M_allocated_capacity = *psVar8;
        local_110.field_2._8_8_ = plVar6[3];
      }
      else {
        local_110.field_2._M_allocated_capacity = *psVar8;
        local_110._M_dataplus._M_p = (pointer)*plVar6;
      }
      local_110._M_string_length = plVar6[1];
      *plVar6 = (long)psVar8;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      out_of_range::create((out_of_range *)local_d0,0x196,&local_110);
      bVar4 = json_sax_dom_callback_parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
              ::parse_error(sax,sVar2,(string *)local_b0,(exception *)local_d0);
      local_d0._0_8_ = &PTR__exception_0016b7a8;
      std::runtime_error::~runtime_error((runtime_error *)(local_d0 + 0x10));
      std::exception::~exception((exception *)local_d0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_110._M_dataplus._M_p != &local_110.field_2) {
        operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
        operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_88._M_dataplus._M_p != &local_88.field_2) {
        operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
      }
      if ((undefined1 *)local_b0._0_8_ != local_b0 + 0x10) {
        operator_delete((void *)local_b0._0_8_,local_a0._M_allocated_capacity + 1);
      }
    }
    if (0x7fefffffffffffff < (long)local_38) goto LAB_00115f04;
    break;
  case 8:
    bVar9 = json_sax_dom_callback_parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
            ::start_array(sax,0xffffffffffffffff);
    if (bVar9) {
      tVar5 = lexer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
              ::scan(this_00);
      *(token_type *)(this + 0x20) = tVar5;
      if (tVar5 != end_array) goto code_r0x001158f5;
      bVar9 = json_sax_dom_callback_parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
              ::end_array(sax);
LAB_0011593d:
      if (bVar9 != false) break;
    }
    goto LAB_00115f60;
  case 9:
    bVar9 = json_sax_dom_callback_parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
            ::start_object(sax,0xffffffffffffffff);
    if (bVar9) {
      tVar5 = lexer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
              ::scan(this_00);
      *(token_type *)(this + 0x20) = tVar5;
      if (tVar5 == end_object) {
        bVar9 = json_sax_dom_callback_parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                ::end_object(sax);
        goto LAB_0011593d;
      }
      if (tVar5 != value_string) {
        sVar2 = *(size_t *)(this + 0x40);
        lexer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
        ::get_token_string((string *)local_d0,this_00);
        local_88.field_2._M_allocated_capacity = *(undefined8 *)(this + 0x50);
        local_88._M_dataplus._M_p = *(pointer *)(this + 0x40);
        local_88._M_string_length = *(size_type *)(this + 0x48);
        local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"object key","");
        parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
        ::exception_message(&local_110,
                            (parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                             *)this,value_string,&local_f0);
        parse_error::create((parse_error *)local_b0,0x65,(position_t *)&local_88,&local_110);
        bVar4 = json_sax_dom_callback_parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                ::parse_error(sax,sVar2,(string *)local_d0,(exception *)local_b0);
        goto LAB_00115e96;
      }
      bVar9 = json_sax_dom_callback_parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
              ::key(sax,local_40);
      if (bVar9) {
        tVar5 = lexer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                ::scan(this_00);
        *(token_type *)(this + 0x20) = tVar5;
        if (tVar5 != name_separator) {
          sVar2 = *(size_t *)(this + 0x40);
          lexer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
          ::get_token_string((string *)local_d0,this_00);
          local_88.field_2._M_allocated_capacity = *(undefined8 *)(this + 0x50);
          local_88._M_dataplus._M_p = *(pointer *)(this + 0x40);
          local_88._M_string_length = *(size_type *)(this + 0x48);
          local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"object separator","")
          ;
          parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
          ::exception_message(&local_110,
                              (parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                               *)this,name_separator,&local_f0);
          parse_error::create((parse_error *)local_b0,0x65,(position_t *)&local_88,&local_110);
          bVar4 = json_sax_dom_callback_parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                  ::parse_error(sax,sVar2,(string *)local_d0,(exception *)local_b0);
          goto LAB_00115e96;
        }
        std::vector<bool,_std::allocator<bool>_>::push_back(&local_68,false);
        tVar5 = lexer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                ::scan(this_00);
        goto LAB_00115a8e;
      }
    }
LAB_00115f60:
    bVar4 = false;
LAB_00115f04:
    if (local_68.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_start.super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
      operator_delete(local_68.super__Bvector_base<std::allocator<bool>_>._M_impl.
                      super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,
                      (long)local_68.super__Bvector_base<std::allocator<bool>_>._M_impl.
                            super__Bvector_impl_data._M_end_of_storage -
                      (long)local_68.super__Bvector_base<std::allocator<bool>_>._M_impl.
                            super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
    }
    return bVar4;
  default:
    sVar2 = *(size_t *)(this + 0x40);
    lexer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
    ::get_token_string((string *)local_d0,this_00);
    local_88.field_2._M_allocated_capacity = *(undefined8 *)(this + 0x50);
    local_88._M_dataplus._M_p = *(pointer *)(this + 0x40);
    local_88._M_string_length = *(size_type *)(this + 0x48);
    local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"value","");
    parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
    ::exception_message(&local_110,
                        (parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                         *)this,literal_or_value,&local_f0);
    parse_error::create((parse_error *)local_b0,0x65,(position_t *)&local_88,&local_110);
    bVar4 = json_sax_dom_callback_parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
            ::parse_error(sax,sVar2,(string *)local_d0,(exception *)local_b0);
    goto LAB_00115e96;
  case 0xe:
    sVar2 = *(size_t *)(this + 0x40);
    lexer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
    ::get_token_string((string *)local_d0,this_00);
    local_88.field_2._M_allocated_capacity = *(undefined8 *)(this + 0x50);
    local_88._M_dataplus._M_p = *(pointer *)(this + 0x40);
    local_88._M_string_length = *(size_type *)(this + 0x48);
    local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"value","");
    parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
    ::exception_message(&local_110,
                        (parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                         *)this,uninitialized,&local_f0);
    parse_error::create((parse_error *)local_b0,0x65,(position_t *)&local_88,&local_110);
    bVar4 = json_sax_dom_callback_parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
            ::parse_error(sax,sVar2,(string *)local_d0,(exception *)local_b0);
    goto LAB_00115e96;
  }
LAB_00115949:
  if (local_68.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
      super__Bit_iterator_base._M_p ==
      local_68.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish
      .super__Bit_iterator_base._M_p &&
      local_68.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish
      .super__Bit_iterator_base._M_offset == 0) {
    bVar4 = true;
    goto LAB_00115f04;
  }
  uVar1 = (ulong)local_68.super__Bvector_base<std::allocator<bool>_>._M_impl.
                 super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset - 1;
  uVar7 = (ulong)local_68.super__Bvector_base<std::allocator<bool>_>._M_impl.
                 super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset + 0x3e;
  if (-1 < (long)uVar1) {
    uVar7 = uVar1;
  }
  if ((local_68.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
       _M_finish.super__Bit_iterator_base._M_p
       [((long)uVar7 >> 6) + ((ulong)((uVar1 & 0x800000000000003f) < 0x8000000000000001) - 1)] >>
       (uVar1 & 0x3f) & 1) == 0) {
    tVar5 = lexer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
            ::scan(this_00);
    *(token_type *)(this + 0x20) = tVar5;
    if (tVar5 == value_separator) {
      tVar5 = lexer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
              ::scan(this_00);
      *(token_type *)(this + 0x20) = tVar5;
      if (tVar5 == value_string) {
        bVar9 = json_sax_dom_callback_parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                ::key(sax,local_40);
        if (!bVar9) goto LAB_00115f60;
        tVar5 = lexer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                ::scan(this_00);
        *(token_type *)(this + 0x20) = tVar5;
        if (tVar5 == name_separator) {
          tVar5 = lexer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                  ::scan(this_00);
          goto LAB_00115a8e;
        }
        sVar2 = *(size_t *)(this + 0x40);
        lexer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
        ::get_token_string((string *)local_d0,this_00);
        local_88.field_2._M_allocated_capacity = *(undefined8 *)(this + 0x50);
        local_88._M_dataplus._M_p = *(pointer *)(this + 0x40);
        local_88._M_string_length = *(size_type *)(this + 0x48);
        local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"object separator","");
        parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
        ::exception_message(&local_110,
                            (parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                             *)this,name_separator,&local_f0);
        parse_error::create((parse_error *)local_b0,0x65,(position_t *)&local_88,&local_110);
        bVar4 = json_sax_dom_callback_parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                ::parse_error(sax,sVar2,(string *)local_d0,(exception *)local_b0);
      }
      else {
        sVar2 = *(size_t *)(this + 0x40);
        lexer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
        ::get_token_string((string *)local_d0,this_00);
        local_88.field_2._M_allocated_capacity = *(undefined8 *)(this + 0x50);
        local_88._M_dataplus._M_p = *(pointer *)(this + 0x40);
        local_88._M_string_length = *(size_type *)(this + 0x48);
        local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"object key","");
        parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
        ::exception_message(&local_110,
                            (parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                             *)this,value_string,&local_f0);
        parse_error::create((parse_error *)local_b0,0x65,(position_t *)&local_88,&local_110);
        bVar4 = json_sax_dom_callback_parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                ::parse_error(sax,sVar2,(string *)local_d0,(exception *)local_b0);
      }
    }
    else {
      if (tVar5 == end_object) {
        bVar3 = json_sax_dom_callback_parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                ::end_object(sax);
        goto LAB_00115aa8;
      }
      sVar2 = *(size_t *)(this + 0x40);
      lexer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
      ::get_token_string((string *)local_d0,this_00);
      local_88.field_2._M_allocated_capacity = *(undefined8 *)(this + 0x50);
      local_88._M_dataplus._M_p = *(pointer *)(this + 0x40);
      local_88._M_string_length = *(size_type *)(this + 0x48);
      local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"object","");
      parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
      ::exception_message(&local_110,
                          (parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                           *)this,end_object,&local_f0);
      parse_error::create((parse_error *)local_b0,0x65,(position_t *)&local_88,&local_110);
      bVar4 = json_sax_dom_callback_parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
              ::parse_error(sax,sVar2,(string *)local_d0,(exception *)local_b0);
    }
  }
  else {
    tVar5 = lexer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
            ::scan(this_00);
    *(token_type *)(this + 0x20) = tVar5;
    if (tVar5 == value_separator) {
      tVar5 = lexer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
              ::scan(this_00);
LAB_00115a8e:
      *(token_type *)(this + 0x20) = tVar5;
      goto LAB_001158a7;
    }
    if (tVar5 == end_array) {
      bVar3 = json_sax_dom_callback_parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
              ::end_array(sax);
LAB_00115aa8:
      if (bVar3 == false) goto LAB_00115f60;
      bVar3 = true;
      bVar9 = local_68.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
              _M_finish.super__Bit_iterator_base._M_offset == 0;
      local_68.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish
      .super__Bit_iterator_base._M_offset =
           local_68.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
           _M_finish.super__Bit_iterator_base._M_offset - 1;
      if (bVar9) {
        local_68.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_finish.super__Bit_iterator_base._M_offset = 0x3f;
        local_68.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_finish.super__Bit_iterator_base._M_p =
             local_68.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
             _M_finish.super__Bit_iterator_base._M_p + -1;
      }
      goto LAB_001158a7;
    }
    sVar2 = *(size_t *)(this + 0x40);
    lexer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
    ::get_token_string((string *)local_d0,this_00);
    local_88.field_2._M_allocated_capacity = *(undefined8 *)(this + 0x50);
    local_88._M_dataplus._M_p = *(pointer *)(this + 0x40);
    local_88._M_string_length = *(size_type *)(this + 0x48);
    local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"array","");
    parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
    ::exception_message(&local_110,
                        (parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                         *)this,end_array,&local_f0);
    parse_error::create((parse_error *)local_b0,0x65,(position_t *)&local_88,&local_110);
    bVar4 = json_sax_dom_callback_parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
            ::parse_error(sax,sVar2,(string *)local_d0,(exception *)local_b0);
  }
LAB_00115e96:
  local_b0._0_8_ = &PTR__exception_0016b7a8;
  std::runtime_error::~runtime_error((runtime_error *)(local_b0 + 0x10));
  std::exception::~exception((exception *)local_b0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_110._M_dataplus._M_p != &local_110.field_2) {
    operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
    operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
  }
  if ((undefined1 *)local_d0._0_8_ != local_d0 + 0x10) {
    operator_delete((void *)local_d0._0_8_,local_c0._M_allocated_capacity + 1);
  }
  goto LAB_00115f04;
code_r0x001158f5:
  std::vector<bool,_std::allocator<bool>_>::push_back(&local_68,true);
  goto LAB_001158a7;
}

Assistant:

bool sax_parse_internal(SAX* sax)
    {
        // stack to remember the hierarchy of structured values we are parsing
        // true = array; false = object
        std::vector<bool> states;
        // value to avoid a goto (see comment where set to true)
        bool skip_to_state_evaluation = false;

        while (true)
        {
            if (not skip_to_state_evaluation)
            {
                // invariant: get_token() was called before each iteration
                switch (last_token)
                {
                    case token_type::begin_object:
                    {
                        if (JSON_HEDLEY_UNLIKELY(not sax->start_object(std::size_t(-1))))
                        {
                            return false;
                        }

                        // closing } -> we are done
                        if (get_token() == token_type::end_object)
                        {
                            if (JSON_HEDLEY_UNLIKELY(not sax->end_object()))
                            {
                                return false;
                            }
                            break;
                        }

                        // parse key
                        if (JSON_HEDLEY_UNLIKELY(last_token != token_type::value_string))
                        {
                            return sax->parse_error(m_lexer.get_position(),
                                                    m_lexer.get_token_string(),
                                                    parse_error::create(101, m_lexer.get_position(),
                                                            exception_message(token_type::value_string, "object key")));
                        }
                        if (JSON_HEDLEY_UNLIKELY(not sax->key(m_lexer.get_string())))
                        {
                            return false;
                        }

                        // parse separator (:)
                        if (JSON_HEDLEY_UNLIKELY(get_token() != token_type::name_separator))
                        {
                            return sax->parse_error(m_lexer.get_position(),
                                                    m_lexer.get_token_string(),
                                                    parse_error::create(101, m_lexer.get_position(),
                                                            exception_message(token_type::name_separator, "object separator")));
                        }

                        // remember we are now inside an object
                        states.push_back(false);

                        // parse values
                        get_token();
                        continue;
                    }

                    case token_type::begin_array:
                    {
                        if (JSON_HEDLEY_UNLIKELY(not sax->start_array(std::size_t(-1))))
                        {
                            return false;
                        }

                        // closing ] -> we are done
                        if (get_token() == token_type::end_array)
                        {
                            if (JSON_HEDLEY_UNLIKELY(not sax->end_array()))
                            {
                                return false;
                            }
                            break;
                        }

                        // remember we are now inside an array
                        states.push_back(true);

                        // parse values (no need to call get_token)
                        continue;
                    }

                    case token_type::value_float:
                    {
                        const auto res = m_lexer.get_number_float();

                        if (JSON_HEDLEY_UNLIKELY(not std::isfinite(res)))
                        {
                            return sax->parse_error(m_lexer.get_position(),
                                                    m_lexer.get_token_string(),
                                                    out_of_range::create(406, "number overflow parsing '" + m_lexer.get_token_string() + "'"));
                        }

                        if (JSON_HEDLEY_UNLIKELY(not sax->number_float(res, m_lexer.get_string())))
                        {
                            return false;
                        }

                        break;
                    }

                    case token_type::literal_false:
                    {
                        if (JSON_HEDLEY_UNLIKELY(not sax->boolean(false)))
                        {
                            return false;
                        }
                        break;
                    }

                    case token_type::literal_null:
                    {
                        if (JSON_HEDLEY_UNLIKELY(not sax->null()))
                        {
                            return false;
                        }
                        break;
                    }

                    case token_type::literal_true:
                    {
                        if (JSON_HEDLEY_UNLIKELY(not sax->boolean(true)))
                        {
                            return false;
                        }
                        break;
                    }

                    case token_type::value_integer:
                    {
                        if (JSON_HEDLEY_UNLIKELY(not sax->number_integer(m_lexer.get_number_integer())))
                        {
                            return false;
                        }
                        break;
                    }

                    case token_type::value_string:
                    {
                        if (JSON_HEDLEY_UNLIKELY(not sax->string(m_lexer.get_string())))
                        {
                            return false;
                        }
                        break;
                    }

                    case token_type::value_unsigned:
                    {
                        if (JSON_HEDLEY_UNLIKELY(not sax->number_unsigned(m_lexer.get_number_unsigned())))
                        {
                            return false;
                        }
                        break;
                    }

                    case token_type::parse_error:
                    {
                        // using "uninitialized" to avoid "expected" message
                        return sax->parse_error(m_lexer.get_position(),
                                                m_lexer.get_token_string(),
                                                parse_error::create(101, m_lexer.get_position(),
                                                        exception_message(token_type::uninitialized, "value")));
                    }

                    default: // the last token was unexpected
                    {
                        return sax->parse_error(m_lexer.get_position(),
                                                m_lexer.get_token_string(),
                                                parse_error::create(101, m_lexer.get_position(),
                                                        exception_message(token_type::literal_or_value, "value")));
                    }
                }
            }
            else
            {
                skip_to_state_evaluation = false;
            }

            // we reached this line after we successfully parsed a value
            if (states.empty())
            {
                // empty stack: we reached the end of the hierarchy: done
                return true;
            }

            if (states.back())  // array
            {
                // comma -> next value
                if (get_token() == token_type::value_separator)
                {
                    // parse a new value
                    get_token();
                    continue;
                }

                // closing ]
                if (JSON_HEDLEY_LIKELY(last_token == token_type::end_array))
                {
                    if (JSON_HEDLEY_UNLIKELY(not sax->end_array()))
                    {
                        return false;
                    }

                    // We are done with this array. Before we can parse a
                    // new value, we need to evaluate the new state first.
                    // By setting skip_to_state_evaluation to false, we
                    // are effectively jumping to the beginning of this if.
                    assert(not states.empty());
                    states.pop_back();
                    skip_to_state_evaluation = true;
                    continue;
                }

                return sax->parse_error(m_lexer.get_position(),
                                        m_lexer.get_token_string(),
                                        parse_error::create(101, m_lexer.get_position(),
                                                exception_message(token_type::end_array, "array")));
            }
            else  // object
            {
                // comma -> next value
                if (get_token() == token_type::value_separator)
                {
                    // parse key
                    if (JSON_HEDLEY_UNLIKELY(get_token() != token_type::value_string))
                    {
                        return sax->parse_error(m_lexer.get_position(),
                                                m_lexer.get_token_string(),
                                                parse_error::create(101, m_lexer.get_position(),
                                                        exception_message(token_type::value_string, "object key")));
                    }

                    if (JSON_HEDLEY_UNLIKELY(not sax->key(m_lexer.get_string())))
                    {
                        return false;
                    }

                    // parse separator (:)
                    if (JSON_HEDLEY_UNLIKELY(get_token() != token_type::name_separator))
                    {
                        return sax->parse_error(m_lexer.get_position(),
                                                m_lexer.get_token_string(),
                                                parse_error::create(101, m_lexer.get_position(),
                                                        exception_message(token_type::name_separator, "object separator")));
                    }

                    // parse values
                    get_token();
                    continue;
                }

                // closing }
                if (JSON_HEDLEY_LIKELY(last_token == token_type::end_object))
                {
                    if (JSON_HEDLEY_UNLIKELY(not sax->end_object()))
                    {
                        return false;
                    }

                    // We are done with this object. Before we can parse a
                    // new value, we need to evaluate the new state first.
                    // By setting skip_to_state_evaluation to false, we
                    // are effectively jumping to the beginning of this if.
                    assert(not states.empty());
                    states.pop_back();
                    skip_to_state_evaluation = true;
                    continue;
                }

                return sax->parse_error(m_lexer.get_position(),
                                        m_lexer.get_token_string(),
                                        parse_error::create(101, m_lexer.get_position(),
                                                exception_message(token_type::end_object, "object")));
            }
        }
    }